

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void __thiscall
mxx::custom_op<int,true>::custom_op<int(*)(int,int)>
          (custom_op<int,true> *this,_func_int_int_int *func)

{
  datatype dt;
  int local_1c;
  
  *(undefined ***)this = &PTR__custom_op_001ab4c0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  this[0x28] = (custom_op<int,true>)0x0;
  dt._vptr_datatype = (_func_int **)custom_function<int(*)(int,int)>;
  dt.mpitype = (MPI_Datatype)func;
  std::function<void(void*,void*,int*)>::operator=
            ((function<void(void*,void*,int*)> *)(this + 8),
             (_Bind<void_(*(int_(*)(int,_int),_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(int_(*)(int,_int),_void_*,_void_*,_int_*)>
              *)&dt);
  dt._vptr_datatype = (_func_int **)&PTR__datatype_001aad50;
  dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
  dt.builtin = true;
  MPI_Type_dup(&ompi_mpi_int,this + 0x30);
  local_1c = 0x543;
  attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::set
            ((MPI_Datatype *)(this + 0x30),&local_1c,
             (function<void_(void_*,_void_*,_int_*)> *)(this + 8));
  MPI_Op_create(custom_op<int,_true>::mpi_user_function,1,this + 0x38);
  datatype::~datatype(&dt);
  return;
}

Assistant:

custom_op(Func func) : m_builtin(false) {
        if (mxx::is_builtin_type<T>::value) {
            // check if the operator is MPI built-in (in case the type
            // is also a MPI built-in type)
            MPI_Op op = get_builtin_op<T, Func>::op(std::forward<Func>(func));
            if (op != MPI_OP_NULL) {
                // this op is builtin, save it as such and don't copy built-in type
                m_builtin = true;
                m_op = op;
                mxx::datatype dt = mxx::get_datatype<T>();
                m_type_copy = dt.type();
            }
        }
        if (!m_builtin) {
            // create user function
            using namespace std::placeholders;
            m_user_func = std::bind(custom_op::custom_function<Func>,
                                  std::forward<Func>(func), _1, _2, _3);
            // get datatype associated with the type `T`
            mxx::datatype dt = mxx::get_datatype<T>();
            // attach function to a copy of the datatype
            MPI_Type_dup(dt.type(), &m_type_copy);
            attr_map<int, func_t>::set(m_type_copy, 1347, m_user_func);
            // create op
            MPI_Op_create(&custom_op::mpi_user_function, IsCommutative, &m_op);
        }
    }